

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* adios2::helper::AvailableIpAddresses_abi_cxx11_(void)

{
  int iVar1;
  int *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string ip;
  ifreq req;
  if_nameindex *p;
  if_nameindex *head;
  int socket_handler;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ips;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar3;
  undefined1 local_75 [37];
  char local_50 [20];
  in_addr local_3c;
  if_nameindex *local_28;
  if_nameindex *local_20;
  int local_10;
  undefined1 local_9;
  
  local_9 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x98cac9);
  local_10 = 0xffffffff;
  local_10 = socket(2,2,0);
  if (-1 < local_10) {
    local_28 = if_nameindex();
    local_20 = local_28;
    if (local_28 != (if_nameindex *)0x0) {
      while( true ) {
        uVar3 = false;
        if (local_28->if_index == 0) {
          uVar3 = local_28->if_name == (char *)0x0;
        }
        if (((uVar3 ^ 0xff) & 1) == 0) break;
        strncpy(local_50,local_28->if_name,0xf);
        iVar1 = ioctl(local_10,0x8915,local_50);
        if (iVar1 < 0) {
          piVar2 = __errno_location();
          if (*piVar2 != 99) {
            if_freenameindex(local_20);
            close(local_10);
            return in_RDI;
          }
        }
        else {
          local_75._1_4_ = local_3c.s_addr;
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  inet_ntoa(local_3c);
          __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_75;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)(local_75 + 5),(char *)__lhs,(allocator *)__args);
          std::allocator<char>::~allocator((allocator<char> *)local_75);
          in_stack_ffffffffffffff5f =
               std::operator!=(__lhs,(char *)CONCAT17(in_stack_ffffffffffffff5f,
                                                      in_stack_ffffffffffffff58));
          if ((bool)in_stack_ffffffffffffff5f) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(uVar3,in_stack_ffffffffffffff70),__args);
          }
          std::__cxx11::string::~string((string *)(local_75 + 5));
        }
        local_28 = local_28 + 1;
      }
      if_freenameindex(local_20);
      close(local_10);
      return in_RDI;
    }
    close(local_10);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string>
AvailableIpAddresses() noexcept
{
    std::vector<std::string> ips;
    int socket_handler = -1;
    if ((socket_handler = socket(PF_INET, SOCK_DGRAM, 0)) < 0)
    {
        return ips;
    }
    struct if_nameindex *head = if_nameindex();
    if (!head)
    {
        close(socket_handler);
        return ips;
    }
    for (struct if_nameindex *p = head; !(p->if_index == 0 && p->if_name == NULL); ++p)
    {
        struct ifreq req;
        strncpy(req.ifr_name, p->if_name, IFNAMSIZ - 1);
        if (ioctl(socket_handler, SIOCGIFADDR, &req) < 0)
        {
            if (errno == EADDRNOTAVAIL)
            {
                continue;
            }
            if_freenameindex(head);
            close(socket_handler);
            return ips;
        }
        const std::string ip = inet_ntoa(((struct sockaddr_in *)&req.ifr_addr)->sin_addr);
        if (ip != "127.0.0.1")
        {
            ips.emplace_back(ip);
        }
    }
    if_freenameindex(head);
    close(socket_handler);
    return ips;
}